

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onBeforeInvoke(RACFGBuilder *this,InvokeNode *invokeNode)

{
  uint uVar1;
  long lVar2;
  EmitterExplicitT<asmjit::v1_14::x86::Compiler> *this_00;
  byte bVar3;
  uint uVar4;
  Error EVar5;
  FuncValuePack *this_01;
  FuncValue *pFVar6;
  Reg *imm_;
  OperandSignature *pOVar7;
  Operand *pOVar8;
  InstId IVar9;
  InvokeNode *pIVar10;
  InvokeNode *argIndex;
  uint32_t valueIndex;
  size_t sVar11;
  bool bVar12;
  Reg dst;
  RAWorkReg *workReg;
  uint32_t auStack_60 [2];
  InvokeNode *local_50;
  RAWorkReg *workReg_1;
  FuncDetail *local_40;
  InvokeNode *local_38;
  
  local_40 = &invokeNode->_funcDetail;
  local_38 = (InvokeNode *)(ulong)(byte)invokeNode->field_0xf4;
  lVar2 = *(long *)(this + 8);
  *(undefined8 *)(lVar2 + 0x198) = *(undefined8 *)invokeNode;
  bVar3 = *(byte *)(lVar2 + 0x50) >> 3;
  argIndex = (InvokeNode *)0x0;
  local_50 = invokeNode;
  do {
    if (argIndex == local_38) {
      this_00 = *(EmitterExplicitT<asmjit::v1_14::x86::Compiler> **)(this + 8);
      *(InvokeNode **)(this_00 + 0x198) = invokeNode;
      if (((invokeNode->field_0x88 & 1) != 0) && (*(uint *)&invokeNode->field_0x108 != 0)) {
        dst.super_BaseReg.super_Operand.super_Operand_._signature._bits =
             *(uint32_t *)(this_00 + 0x50);
        dst.super_BaseReg.super_Operand.super_Operand_._baseId = 4;
        dst.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
        dst.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
        workReg = (RAWorkReg *)0x4;
        auStack_60[1] = 0;
        auStack_60[0] = *(uint *)&invokeNode->field_0x108;
        EVar5 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::sub
                          (this_00,(Gp *)&dst,(Imm *)&workReg);
        if (EVar5 != 0) {
          return EVar5;
        }
      }
      if (*(int *)&invokeNode->field_0x10c != 0) {
        sVar11 = 0;
        while ((sVar11 != 4 &&
               (pFVar6 = FuncValuePack::operator[]((FuncValuePack *)&invokeNode->field_0x10c,sVar11)
               , pFVar6->_data != 0))) {
          pOVar8 = InvokeNode::OperandPack::operator[](&invokeNode->_rets,sVar11);
          if (((pOVar8->super_Operand_)._signature._bits & 7) == 1) {
            EVar5 = BaseRAPass::virtIndexAsWorkReg
                              (*(BaseRAPass **)this,(pOVar8->super_Operand_)._baseId - 0x100,
                               &workReg_1);
            if (EVar5 != 0) {
              return EVar5;
            }
            uVar4 = pFVar6->_data;
            if ((uVar4 >> 8 & 1) != 0) {
              if (uVar4 >> 0x18 == 0x16) {
                dst.super_BaseReg.super_Operand.super_Operand_._signature._bits =
                     *(uint32_t *)(workReg_1 + 0x20);
                if ((dst.super_BaseReg.super_Operand.super_Operand_._signature._bits & 0xf00) !=
                    0x100) {
                  return 0x19;
                }
                dst.super_BaseReg.super_Operand.super_Operand_._baseId =
                     *(uint32_t *)(workReg_1 + 4);
                dst.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
                dst.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
                workReg = (RAWorkReg *)0x2;
                auStack_60[0] = 0;
                auStack_60[1] = 0;
                uVar4 = (uint)(byte)TypeUtils::_typeData[*(byte *)(*(long *)(workReg_1 + 8) + 0xd)];
                if ((char)pFVar6->_data != '\0') {
                  uVar4 = pFVar6->_data;
                }
                if ((char)uVar4 == '+') {
                  EVar5 = BaseRAPass::useTemporaryMem(*(BaseRAPass **)this,(BaseMem *)&workReg,8,4);
                  if (EVar5 != 0) {
                    return EVar5;
                  }
                  workReg._0_4_ = CONCAT13(8,workReg._0_3_);
                  EVar5 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::fstp
                                    (*(EmitterExplicitT<asmjit::v1_14::x86::Compiler> **)(this + 8),
                                     (Mem *)&workReg);
                  if (EVar5 != 0) {
                    return EVar5;
                  }
                  IVar9 = 0x1d6;
                  if (this[0x292] != (RACFGBuilder)0x0) {
                    IVar9 = 0x4c1;
                  }
                  EVar5 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),IVar9,(Operand_ *)&dst,
                                              (Operand_ *)&workReg);
                }
                else {
                  if ((uVar4 & 0xff) != 0x2a) {
                    return 0x19;
                  }
                  EVar5 = BaseRAPass::useTemporaryMem(*(BaseRAPass **)this,(BaseMem *)&workReg,4,4);
                  if (EVar5 != 0) {
                    return EVar5;
                  }
                  workReg._0_4_ = CONCAT13(4,workReg._0_3_);
                  EVar5 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::fstp
                                    (*(EmitterExplicitT<asmjit::v1_14::x86::Compiler> **)(this + 8),
                                     (Mem *)&workReg);
                  if (EVar5 != 0) {
                    return EVar5;
                  }
                  IVar9 = 0x1d9;
                  if (this[0x292] != (RACFGBuilder)0x0) {
                    IVar9 = 0x4c5;
                  }
                  EVar5 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),IVar9,(Operand_ *)&dst,
                                              (Operand_ *)&workReg);
                }
                if (EVar5 != 0) {
                  return EVar5;
                }
              }
              else {
                uVar1 = *(uint *)(workReg_1 + 0x20);
                dst.super_BaseReg.super_Operand.super_Operand_._signature._bits._0_1_ =
                     (char)(uVar4 >> 0x18);
                pOVar7 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                         operator[]<asmjit::v1_14::RegType>
                                   ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                    (_archTraits + 0xec),(RegType *)&dst);
                if (((uVar1 ^ pOVar7->_bits) & 0xf00) != 0) {
                  return 0x19;
                }
              }
            }
          }
          sVar11 = sVar11 + 1;
        }
      }
      *(uint *)(*(long *)(this + 0x10) + 0xc) = *(uint *)(*(long *)(this + 0x10) + 0xc) | 0x1000;
      lVar2 = *(long *)(*(long *)this + 0x98);
      *(uint *)(lVar2 + 0x2d0) = *(uint *)(lVar2 + 0x2d0) | 0x20;
      uVar4 = *(uint *)&invokeNode->field_0x108;
      if (*(uint *)&invokeNode->field_0x108 < *(uint *)(lVar2 + 0x2e0)) {
        uVar4 = *(uint *)(lVar2 + 0x2e0);
      }
      *(uint *)(lVar2 + 0x2e0) = uVar4;
      return 0;
    }
    this_01 = FuncDetail::argPack(local_40,(size_t)argIndex);
    sVar11 = 0;
    while ((sVar11 != 4 && (pFVar6 = FuncValuePack::operator[](this_01,sVar11), pFVar6->_data != 0))
          ) {
      pFVar6 = FuncValuePack::operator[](this_01,sVar11);
      pIVar10 = argIndex;
      imm_ = (Reg *)InvokeNode::arg(invokeNode,(size_t)argIndex,sVar11);
      uVar4 = (imm_->super_BaseReg).super_Operand.super_Operand_._signature._bits;
      if (uVar4 != 0) {
        uVar4 = uVar4 & 7;
        if (uVar4 == 4) {
          if ((pFVar6->_data & 0x100) == 0) {
            EVar5 = moveImmToStackArg(this,pIVar10,pFVar6,(Imm *)imm_);
LAB_00143cbe:
            if (EVar5 != 0) {
              return EVar5;
            }
          }
          else {
            dst.super_BaseReg.super_Operand.super_Operand_._signature._bits = 1;
            dst.super_BaseReg.super_Operand.super_Operand_._baseId = 0xff;
            dst.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
            dst.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
            EVar5 = moveImmToRegArg(this,pIVar10,pFVar6,(Imm *)imm_,&dst.super_BaseReg);
            if (EVar5 != 0) {
              return EVar5;
            }
LAB_00143c83:
            pOVar8 = InvokeNode::OperandPack::operator[](invokeNode->_args + (long)argIndex,sVar11);
            (pOVar8->super_Operand_)._signature =
                 (Signature)dst.super_BaseReg.super_Operand.super_Operand_._signature._bits;
            (pOVar8->super_Operand_)._baseId =
                 dst.super_BaseReg.super_Operand.super_Operand_._baseId;
            *(ulong *)(pOVar8->super_Operand_)._data =
                 CONCAT44(dst.super_BaseReg.super_Operand.super_Operand_._data[1],
                          dst.super_BaseReg.super_Operand.super_Operand_._data[0]);
          }
        }
        else if (uVar4 == 1) {
          uVar4 = (imm_->super_BaseReg).super_Operand.super_Operand_._baseId - 0x100;
          pIVar10 = (InvokeNode *)(ulong)uVar4;
          EVar5 = BaseRAPass::virtIndexAsWorkReg(*(BaseRAPass **)this,uVar4,&workReg);
          if (EVar5 != 0) {
            return EVar5;
          }
          uVar4 = pFVar6->_data;
          if ((uVar4 >> 8 & 1) == 0) {
            if ((uVar4 >> 10 & 1) != 0) {
              uVar4 = (imm_->super_BaseReg).super_Operand.super_Operand_._signature._bits;
              if ((uVar4 & 0xf00) == 0) {
                if (bVar3 != (byte)(uVar4 >> 3)) {
                  return 0x19;
                }
              }
              else {
                dst.super_BaseReg.super_Operand.super_Operand_._signature._bits = 1;
                dst.super_BaseReg.super_Operand.super_Operand_._baseId = 0xff;
                dst.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
                dst.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
                pIVar10 = invokeNode;
                moveVecToPtr(this,invokeNode,pFVar6,(Vec *)imm_,&dst.super_BaseReg);
                imm_ = &dst;
              }
            }
            EVar5 = moveRegToStackArg(this,pIVar10,pFVar6,&imm_->super_BaseReg);
            goto LAB_00143cbe;
          }
          uVar1 = *(uint *)(workReg + 0x20);
          dst.super_BaseReg.super_Operand.super_Operand_._signature._bits._0_1_ =
               (char)(uVar4 >> 0x18);
          pOVar7 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                   operator[]<asmjit::v1_14::RegType>
                             ((Array<asmjit::v1_14::OperandSignature,_32UL> *)(_archTraits + 0xec),
                              (RegType *)&dst);
          invokeNode = local_50;
          if ((pFVar6->_data & 0x400) == 0) {
            bVar12 = ((uVar1 ^ pOVar7->_bits) & 0xf00) == 0;
          }
          else {
            uVar4 = (imm_->super_BaseReg).super_Operand.super_Operand_._signature._bits;
            if ((uVar4 & 0xf00) != 0) {
              dst.super_BaseReg.super_Operand.super_Operand_._signature._bits = 1;
              dst.super_BaseReg.super_Operand.super_Operand_._baseId = 0xff;
              dst.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
              dst.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
              moveVecToPtr(this,local_50,pFVar6,(Vec *)imm_,&dst.super_BaseReg);
              goto LAB_00143c83;
            }
            bVar12 = bVar3 == (byte)(uVar4 >> 3);
          }
          if (!bVar12) {
            return 0x19;
          }
        }
      }
      sVar11 = sVar11 + 1;
    }
    argIndex = (InvokeNode *)&argIndex->field_0x1;
  } while( true );
}

Assistant:

Error RACFGBuilder::onBeforeInvoke(InvokeNode* invokeNode) noexcept {
  const FuncDetail& fd = invokeNode->detail();
  uint32_t argCount = invokeNode->argCount();

  cc()->_setCursor(invokeNode->prev());
  RegType nativeRegType = cc()->_gpSignature.regType();

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        break;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup argGroup = Reg::groupOf(arg.regType());

          if (arg.isIndirect()) {
            if (reg.isGp()) {
              if (reg.type() != nativeRegType)
                return DebugUtils::errored(kErrorInvalidAssignment);
              // It's considered allocated if this is an indirect argument and the user used GP.
              continue;
            }

            BaseReg indirectReg;
            moveVecToPtr(invokeNode, arg, reg.as<Vec>(), &indirectReg);
            invokeNode->_args[argIndex][valueIndex] = indirectReg;
          }
          else {
            if (regGroup != argGroup) {
              // TODO: Conversion is not supported.
              return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
        }
        else {
          if (arg.isIndirect()) {
            if (reg.isGp()) {
              if (reg.type() != nativeRegType)
                return DebugUtils::errored(kErrorInvalidAssignment);

              ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, reg));
              continue;
            }

            BaseReg indirectReg;
            moveVecToPtr(invokeNode, arg, reg.as<Vec>(), &indirectReg);
            ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, indirectReg));
          }
          else {
            ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, reg));
          }
        }
      }
      else if (op.isImm()) {
        if (arg.isReg()) {
          BaseReg reg;
          ASMJIT_PROPAGATE(moveImmToRegArg(invokeNode, arg, op.as<Imm>(), &reg));
          invokeNode->_args[argIndex][valueIndex] = reg;
        }
        else {
          ASMJIT_PROPAGATE(moveImmToStackArg(invokeNode, arg, op.as<Imm>()));
        }
      }
    }
  }

  cc()->_setCursor(invokeNode);
  if (fd.hasFlag(CallConvFlags::kCalleePopsStack) && fd.argStackSize() != 0)
    ASMJIT_PROPAGATE(cc()->sub(cc()->zsp(), fd.argStackSize()));

  if (fd.hasRet()) {
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      const FuncValue& ret = fd.ret(valueIndex);
      if (!ret)
        break;

      const Operand& op = invokeNode->ret(valueIndex);
      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (ret.isReg()) {
          if (ret.regType() == RegType::kX86_St) {
            if (workReg->group() != RegGroup::kVec)
              return DebugUtils::errored(kErrorInvalidAssignment);

            Reg dst(workReg->signature(), workReg->virtId());
            Mem mem;

            TypeId typeId = TypeUtils::scalarOf(workReg->typeId());
            if (ret.hasTypeId())
              typeId = ret.typeId();

            switch (typeId) {
              case TypeId::kFloat32:
                ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 4, 4));
                mem.setSize(4);
                ASMJIT_PROPAGATE(cc()->fstp(mem));
                ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovss, Inst::kIdVmovss), dst.as<Xmm>(), mem));
                break;

              case TypeId::kFloat64:
                ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 8, 4));
                mem.setSize(8);
                ASMJIT_PROPAGATE(cc()->fstp(mem));
                ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovsd, Inst::kIdVmovsd), dst.as<Xmm>(), mem));
                break;

              default:
                return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
          else {
            RegGroup regGroup = workReg->group();
            RegGroup retGroup = Reg::groupOf(ret.regType());

            if (regGroup != retGroup) {
              // TODO: Conversion is not supported.
              return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
        }
      }
    }
  }

  // This block has function call(s).
  _curBlock->addFlags(RABlockFlags::kHasFuncCalls);
  _pass->func()->frame().addAttributes(FuncAttributes::kHasFuncCalls);
  _pass->func()->frame().updateCallStackSize(fd.argStackSize());

  return kErrorOk;
}